

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O2

void __thiscall SimulationResult::Load(SimulationResult *this,string *filename)

{
  pointer pdVar1;
  istream *piVar2;
  ostream *poVar3;
  E *this_00;
  string buffer;
  double r;
  stringstream ss;
  ostream local_3b0 [376];
  ifstream fp;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&fp,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_fp + -0x18)] & 5) == 0) {
    pdVar1 = (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar1;
    }
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fp,(string *)&buffer);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 2) != 0) break;
      std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&buffer,_S_in);
      std::istream::_M_extract<double>((double *)&ss);
      std::vector<double,_std::allocator<double>_>::push_back(&this->_m_rewards,&r);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    }
    this->_m_nr_stored =
         (uint)((ulong)((long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    UpdateStatistics(this);
    std::__cxx11::string::~string((string *)&buffer);
    std::ifstream::~ifstream(&fp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_3b0,"SimulationResult::Load: failed to ");
  poVar3 = std::operator<<(poVar3,"open file ");
  std::operator<<(poVar3,(string *)filename);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void SimulationResult::Load(string filename)
{
    double r;

    ifstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "SimulationResult::Load: failed to "
           << "open file " << filename;
        throw E(ss);
    }

    _m_rewards.clear();

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        is >> r;
        _m_rewards.push_back(r);
    }

    _m_nr_stored=_m_rewards.size();
    UpdateStatistics();
}